

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderLoader.cpp
# Opt level: O0

void __thiscall
Assimp::BlenderImporter::AddBlendParams(BlenderImporter *this,aiMaterial *result,Material *source)

{
  float local_c8;
  float local_c4;
  int local_c0;
  float mirrorGlossAnisotropic;
  int mirrorGlossSamples;
  float mirrorGlossThreshold;
  float mirrorGlossAmount;
  int mirrorFadeTo;
  float mirrorMaxDist;
  int mirrorDepth;
  float mirrorBlend;
  float mirrorFresnel;
  aiColor3D mirrorColor;
  float mirrorReflectivity;
  int mirrorUse;
  int transparencyGlossSamples;
  float transparencyGlossThreshold;
  float transparencyGlossAmount;
  int transparencyDepth;
  float transparencyLimit;
  float transparencyFalloff;
  float transparencyFilter;
  float transparencyIor;
  float transparencyBlend;
  float transparencyFresnel;
  float transparencySpecular;
  float transparencyAlpha;
  int transparencyMethod;
  int transparencyUse;
  int specularHardness;
  int specularRamp;
  int specularShader;
  float specularIntensity;
  aiColor3D specularColor;
  int diffuseRamp;
  int diffuseShader;
  float diffuseIntensity;
  aiColor3D diffuseColor;
  Material *source_local;
  aiMaterial *result_local;
  BlenderImporter *this_local;
  
  diffuseColor._4_8_ = source;
  aiColor3D::aiColor3D((aiColor3D *)&diffuseShader,source->r,source->g,source->b);
  aiMaterial::AddProperty(result,(aiColor3D *)&diffuseShader,1,"$mat.blend.diffuse.color",0,0);
  diffuseRamp = *(int *)(diffuseColor._4_8_ + 0x468);
  aiMaterial::AddProperty(result,(float *)&diffuseRamp,1,"$mat.blend.diffuse.intensity",0,0);
  specularColor.b = (ai_real)(int)*(short *)(diffuseColor._4_8_ + 0x590);
  aiMaterial::AddProperty(result,(int *)&specularColor.b,1,"$mat.blend.diffuse.shader",0,0);
  specularColor.g = 0.0;
  aiMaterial::AddProperty(result,(int *)&specularColor.g,1,"$mat.blend.diffuse.ramp",0,0);
  aiColor3D::aiColor3D
            ((aiColor3D *)&specularShader,*(ai_real *)(diffuseColor._4_8_ + 0x434),
             *(ai_real *)(diffuseColor._4_8_ + 0x438),*(ai_real *)(diffuseColor._4_8_ + 0x43c));
  aiMaterial::AddProperty(result,(aiColor3D *)&specularShader,1,"$mat.blend.specular.color",0,0);
  specularRamp = *(int *)(diffuseColor._4_8_ + 0x48c);
  aiMaterial::AddProperty(result,(float *)&specularRamp,1,"$mat.blend.specular.intensity",0,0);
  specularHardness = (int)*(short *)(diffuseColor._4_8_ + 0x592);
  aiMaterial::AddProperty(result,&specularHardness,1,"$mat.blend.specular.shader",0,0);
  transparencyUse = 0;
  aiMaterial::AddProperty(result,&transparencyUse,1,"$mat.blend.specular.ramp",0,0);
  transparencyMethod = (int)*(short *)(diffuseColor._4_8_ + 0x440);
  aiMaterial::AddProperty(result,&transparencyMethod,1,"$mat.blend.specular.hardness",0,0);
  transparencyAlpha = (float)(uint)((*(uint *)(diffuseColor._4_8_ + 0x470) & 0x10000) != 0);
  aiMaterial::AddProperty(result,(int *)&transparencyAlpha,1,"$mat.blend.transparency.use",0,0);
  if ((*(uint *)(diffuseColor._4_8_ + 0x470) & 0x20000) == 0) {
    local_c8 = (float)(uint)((*(uint *)(diffuseColor._4_8_ + 0x470) & 0x40) != 0);
  }
  else {
    local_c8 = 2.8026e-45;
  }
  transparencySpecular = local_c8;
  aiMaterial::AddProperty
            (result,(int *)&transparencySpecular,1,"$mat.blend.transparency.method",0,0);
  transparencyFresnel = *(float *)(diffuseColor._4_8_ + 0x464);
  aiMaterial::AddProperty(result,&transparencyFresnel,1,"$mat.blend.transparency.alpha",0,0);
  transparencyBlend = *(float *)(diffuseColor._4_8_ + 0x488);
  aiMaterial::AddProperty(result,&transparencyBlend,1,"$mat.blend.transparency.specular",0,0);
  transparencyIor = *(float *)(diffuseColor._4_8_ + 0x4a0);
  aiMaterial::AddProperty(result,&transparencyIor,1,"$mat.blend.transparency.fresnel",0,0);
  transparencyFilter = *(float *)(diffuseColor._4_8_ + 0x4a4);
  aiMaterial::AddProperty(result,&transparencyFilter,1,"$mat.blend.transparency.blend",0,0);
  transparencyFalloff = *(float *)(diffuseColor._4_8_ + 0x484);
  aiMaterial::AddProperty(result,&transparencyFalloff,1,"$mat.blend.transparency.ior",0,0);
  transparencyLimit = *(float *)(diffuseColor._4_8_ + 0x4a8);
  aiMaterial::AddProperty(result,&transparencyLimit,1,"$mat.blend.transparency.filter",0,0);
  transparencyDepth = *(int *)(diffuseColor._4_8_ + 0x4b0);
  aiMaterial::AddProperty
            (result,(float *)&transparencyDepth,1,"$mat.blend.transparency.falloff",0,0);
  transparencyGlossAmount = *(float *)(diffuseColor._4_8_ + 0x4ac);
  aiMaterial::AddProperty(result,&transparencyGlossAmount,1,"$mat.blend.transparency.limit",0,0);
  transparencyGlossThreshold = (float)(int)*(short *)(diffuseColor._4_8_ + 0x54e);
  aiMaterial::AddProperty
            (result,(int *)&transparencyGlossThreshold,1,"$mat.blend.transparency.depth",0,0);
  transparencyGlossSamples = *(int *)(diffuseColor._4_8_ + 0x4b8);
  aiMaterial::AddProperty
            (result,(float *)&transparencyGlossSamples,1,"$mat.blend.transparency.glossAmount",0,0);
  mirrorUse = *(int *)(diffuseColor._4_8_ + 0x4c0);
  aiMaterial::AddProperty(result,(float *)&mirrorUse,1,"$mat.blend.transparency.glossThreshold",0,0)
  ;
  mirrorReflectivity = (float)(int)*(short *)(diffuseColor._4_8_ + 0x552);
  aiMaterial::AddProperty
            (result,(int *)&mirrorReflectivity,1,"$mat.blend.transparency.glossSamples",0,0);
  mirrorColor.b = (ai_real)(uint)((*(uint *)(diffuseColor._4_8_ + 0x470) & 0x40000) != 0);
  aiMaterial::AddProperty(result,(int *)&mirrorColor.b,1,"$mat.blend.mirror.use",0,0);
  mirrorColor.g = *(ai_real *)(diffuseColor._4_8_ + 0x460);
  aiMaterial::AddProperty(result,&mirrorColor.g,1,"$mat.blend.mirror.reflectivity",0,0);
  aiColor3D::aiColor3D
            ((aiColor3D *)&mirrorBlend,*(ai_real *)(diffuseColor._4_8_ + 0x450),
             *(ai_real *)(diffuseColor._4_8_ + 0x454),*(ai_real *)(diffuseColor._4_8_ + 0x458));
  aiMaterial::AddProperty(result,(aiColor3D *)&mirrorBlend,1,"$mat.blend.mirror.color",0,0);
  mirrorDepth = *(int *)(diffuseColor._4_8_ + 0x498);
  aiMaterial::AddProperty(result,(float *)&mirrorDepth,1,"$mat.blend.mirror.fresnel",0,0);
  mirrorMaxDist = *(float *)(diffuseColor._4_8_ + 0x49c);
  aiMaterial::AddProperty(result,&mirrorMaxDist,1,"$mat.blend.mirror.blend",0,0);
  mirrorFadeTo = (int)*(short *)(diffuseColor._4_8_ + 0x54c);
  aiMaterial::AddProperty(result,&mirrorFadeTo,1,"$mat.blend.mirror.depth",0,0);
  mirrorGlossAmount = *(float *)(diffuseColor._4_8_ + 0x4c8);
  aiMaterial::AddProperty(result,&mirrorGlossAmount,1,"$mat.blend.mirror.maxDist",0,0);
  mirrorGlossThreshold = (float)(int)*(short *)(diffuseColor._4_8_ + 0x554);
  aiMaterial::AddProperty(result,(int *)&mirrorGlossThreshold,1,"$mat.blend.mirror.fadeTo",0,0);
  mirrorGlossSamples = *(int *)(diffuseColor._4_8_ + 0x4b4);
  aiMaterial::AddProperty(result,(float *)&mirrorGlossSamples,1,"$mat.blend.mirror.glossAmount",0,0)
  ;
  mirrorGlossAnisotropic = *(float *)(diffuseColor._4_8_ + 0x4bc);
  aiMaterial::AddProperty(result,&mirrorGlossAnisotropic,1,"$mat.blend.mirror.glossThreshold",0,0);
  local_c0 = (int)*(short *)(diffuseColor._4_8_ + 0x550);
  aiMaterial::AddProperty(result,&local_c0,1,"$mat.blend.mirror.glossSamples",0,0);
  local_c4 = *(float *)(diffuseColor._4_8_ + 0x4c4);
  aiMaterial::AddProperty(result,&local_c4,1,"$mat.blend.mirror.glossAnisotropic",0,0);
  return;
}

Assistant:

void BlenderImporter::AddBlendParams(aiMaterial* result, const Material* source)
{
    aiColor3D diffuseColor(source->r, source->g, source->b);
    result->AddProperty(&diffuseColor, 1, "$mat.blend.diffuse.color", 0, 0);

    float diffuseIntensity = source->ref;
    result->AddProperty(&diffuseIntensity, 1, "$mat.blend.diffuse.intensity", 0, 0);

    int diffuseShader = source->diff_shader;
    result->AddProperty(&diffuseShader, 1, "$mat.blend.diffuse.shader", 0, 0);

    int diffuseRamp = 0;
    result->AddProperty(&diffuseRamp, 1, "$mat.blend.diffuse.ramp", 0, 0);


    aiColor3D specularColor(source->specr, source->specg, source->specb);
    result->AddProperty(&specularColor, 1, "$mat.blend.specular.color", 0, 0);

    float specularIntensity = source->spec;
    result->AddProperty(&specularIntensity, 1, "$mat.blend.specular.intensity", 0, 0);

    int specularShader = source->spec_shader;
    result->AddProperty(&specularShader, 1, "$mat.blend.specular.shader", 0, 0);

    int specularRamp = 0;
    result->AddProperty(&specularRamp, 1, "$mat.blend.specular.ramp", 0, 0);

    int specularHardness = source->har;
    result->AddProperty(&specularHardness, 1, "$mat.blend.specular.hardness", 0, 0);


    int transparencyUse = source->mode & MA_TRANSPARENCY ? 1 : 0;
    result->AddProperty(&transparencyUse, 1, "$mat.blend.transparency.use", 0, 0);

    int transparencyMethod = source->mode & MA_RAYTRANSP ? 2 : (source->mode & MA_ZTRANSP ? 1 : 0);
    result->AddProperty(&transparencyMethod, 1, "$mat.blend.transparency.method", 0, 0);

    float transparencyAlpha = source->alpha;
    result->AddProperty(&transparencyAlpha, 1, "$mat.blend.transparency.alpha", 0, 0);

    float transparencySpecular = source->spectra;
    result->AddProperty(&transparencySpecular, 1, "$mat.blend.transparency.specular", 0, 0);

    float transparencyFresnel = source->fresnel_tra;
    result->AddProperty(&transparencyFresnel, 1, "$mat.blend.transparency.fresnel", 0, 0);

    float transparencyBlend = source->fresnel_tra_i;
    result->AddProperty(&transparencyBlend, 1, "$mat.blend.transparency.blend", 0, 0);

    float transparencyIor = source->ang;
    result->AddProperty(&transparencyIor, 1, "$mat.blend.transparency.ior", 0, 0);

    float transparencyFilter = source->filter;
    result->AddProperty(&transparencyFilter, 1, "$mat.blend.transparency.filter", 0, 0);

    float transparencyFalloff = source->tx_falloff;
    result->AddProperty(&transparencyFalloff, 1, "$mat.blend.transparency.falloff", 0, 0);

    float transparencyLimit = source->tx_limit;
    result->AddProperty(&transparencyLimit, 1, "$mat.blend.transparency.limit", 0, 0);

    int transparencyDepth = source->ray_depth_tra;
    result->AddProperty(&transparencyDepth, 1, "$mat.blend.transparency.depth", 0, 0);

    float transparencyGlossAmount = source->gloss_tra;
    result->AddProperty(&transparencyGlossAmount, 1, "$mat.blend.transparency.glossAmount", 0, 0);

    float transparencyGlossThreshold = source->adapt_thresh_tra;
    result->AddProperty(&transparencyGlossThreshold, 1, "$mat.blend.transparency.glossThreshold", 0, 0);

    int transparencyGlossSamples = source->samp_gloss_tra;
    result->AddProperty(&transparencyGlossSamples, 1, "$mat.blend.transparency.glossSamples", 0, 0);


    int mirrorUse = source->mode & MA_RAYMIRROR ? 1 : 0;
    result->AddProperty(&mirrorUse, 1, "$mat.blend.mirror.use", 0, 0);

    float mirrorReflectivity = source->ray_mirror;
    result->AddProperty(&mirrorReflectivity, 1, "$mat.blend.mirror.reflectivity", 0, 0);

    aiColor3D mirrorColor(source->mirr, source->mirg, source->mirb);
    result->AddProperty(&mirrorColor, 1, "$mat.blend.mirror.color", 0, 0);

    float mirrorFresnel = source->fresnel_mir;
    result->AddProperty(&mirrorFresnel, 1, "$mat.blend.mirror.fresnel", 0, 0);

    float mirrorBlend = source->fresnel_mir_i;
    result->AddProperty(&mirrorBlend, 1, "$mat.blend.mirror.blend", 0, 0);

    int mirrorDepth = source->ray_depth;
    result->AddProperty(&mirrorDepth, 1, "$mat.blend.mirror.depth", 0, 0);

    float mirrorMaxDist = source->dist_mir;
    result->AddProperty(&mirrorMaxDist, 1, "$mat.blend.mirror.maxDist", 0, 0);

    int mirrorFadeTo = source->fadeto_mir;
    result->AddProperty(&mirrorFadeTo, 1, "$mat.blend.mirror.fadeTo", 0, 0);

    float mirrorGlossAmount = source->gloss_mir;
    result->AddProperty(&mirrorGlossAmount, 1, "$mat.blend.mirror.glossAmount", 0, 0);

    float mirrorGlossThreshold = source->adapt_thresh_mir;
    result->AddProperty(&mirrorGlossThreshold, 1, "$mat.blend.mirror.glossThreshold", 0, 0);

    int mirrorGlossSamples = source->samp_gloss_mir;
    result->AddProperty(&mirrorGlossSamples, 1, "$mat.blend.mirror.glossSamples", 0, 0);

    float mirrorGlossAnisotropic = source->aniso_gloss_mir;
    result->AddProperty(&mirrorGlossAnisotropic, 1, "$mat.blend.mirror.glossAnisotropic", 0, 0);
}